

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

void Lpk_NodeRecordImpact(Lpk_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  
  iVar4 = p->pObj->Id;
  if ((-1 < (long)iVar4) && (iVar4 < p->vVisited->nSize)) {
    p_00 = (Vec_Ptr_t *)p->vVisited->pArray[iVar4];
    p_00->nSize = 0;
    piVar6 = p->pCuts[0].pLeaves;
    for (lVar3 = 0; lVar3 < p->nCuts; lVar3 = lVar3 + 1) {
      for (uVar5 = 0; uVar5 < (*(uint *)(p->pCuts + lVar3) & 0x3f); uVar5 = uVar5 + 1) {
        pAVar1 = Abc_NtkObj(p->pNtk,piVar6[uVar5]);
        if ((*(uint *)&pAVar1->field_0x14 & 0x40) == 0) {
          *(uint *)&pAVar1->field_0x14 = *(uint *)&pAVar1->field_0x14 | 0x40;
          Vec_PtrPush(p_00,(void *)(long)pAVar1->Id);
          Vec_PtrPush(p_00,(void *)(long)(pAVar1->vFanouts).nSize);
        }
      }
      piVar6 = piVar6 + 0x35;
    }
    for (iVar4 = 0; iVar4 < p_00->nSize; iVar4 = iVar4 + 2) {
      pvVar2 = Vec_PtrEntry(p_00,iVar4);
      pAVar1 = Abc_NtkObj(p->pNtk,(int)pvVar2);
      pAVar1->field_0x14 = pAVar1->field_0x14 & 0xbf;
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

void Lpk_NodeRecordImpact( Lpk_Man_t * p )
{
    Lpk_Cut_t * pCut;
    Vec_Ptr_t * vNodes = Vec_VecEntry( p->vVisited, p->pObj->Id );
    Abc_Obj_t * pNode;
    int i, k;
    // collect the nodes that impact the given node
    Vec_PtrClear( vNodes );
    for ( i = 0; i < p->nCuts; i++ )
    {
        pCut = p->pCuts + i;
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
        {
            pNode = Abc_NtkObj( p->pNtk, pCut->pLeaves[k] );
            if ( pNode->fMarkC )
                continue;
            pNode->fMarkC = 1;
            Vec_PtrPush( vNodes, (void *)(ABC_PTRUINT_T)pNode->Id );
            Vec_PtrPush( vNodes, (void *)(ABC_PTRUINT_T)Abc_ObjFanoutNum(pNode) );
        }
    }
    // clear the marks
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNode = Abc_NtkObj( p->pNtk, (int)(ABC_PTRUINT_T)pNode );
        pNode->fMarkC = 0;
        i++;
    }
//printf( "%d ", Vec_PtrSize(vNodes) );
}